

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O0

void __thiscall miniros::TopicManager::getBusInfo(TopicManager *this,XmlRpcValue *info)

{
  bool bVar1;
  long in_RDI;
  SubscriptionPtr t_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
  *__range2_1;
  scoped_lock<std::mutex> lock_1;
  PublicationPtr t;
  iterator __end2;
  iterator __begin2;
  V_Publication *__range2;
  scoped_lock<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff68;
  XmlRpcValue *in_stack_ffffffffffffff70;
  shared_ptr<miniros::Subscription> local_80;
  _Self local_70;
  _Self local_68;
  long local_60;
  XmlRpcValue local_40;
  shared_ptr<miniros::Publication> *local_30;
  __normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
  local_28;
  long local_20;
  
  XmlRpc::XmlRpcValue::setSize
            (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  std::scoped_lock<std::recursive_mutex>::scoped_lock
            ((scoped_lock<std::recursive_mutex> *)in_stack_ffffffffffffff70,
             (mutex_type *)in_stack_ffffffffffffff68);
  local_20 = in_RDI + 0x68;
  local_28._M_current =
       (shared_ptr<miniros::Publication> *)
       std::
       vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
       ::begin((vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                *)in_stack_ffffffffffffff68);
  local_30 = (shared_ptr<miniros::Publication> *)
             std::
             vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
             ::end((vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                    *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
    ::operator*(&local_28);
    in_stack_ffffffffffffff70 = &local_40;
    std::shared_ptr<miniros::Publication>::shared_ptr
              ((shared_ptr<miniros::Publication> *)in_stack_ffffffffffffff70,
               (shared_ptr<miniros::Publication> *)in_stack_ffffffffffffff68);
    std::__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4fb570);
    Publication::getInfo((Publication *)this,info);
    std::shared_ptr<miniros::Publication>::~shared_ptr((shared_ptr<miniros::Publication> *)0x4fb58c)
    ;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
    ::operator++(&local_28);
  }
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x4fb5cf);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_60 = in_RDI + 0x28;
  local_68._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
       ::begin((list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
                *)in_stack_ffffffffffffff68);
  local_70._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
       ::end((list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
              *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = std::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    std::_List_iterator<std::shared_ptr<miniros::Subscription>_>::operator*
              ((_List_iterator<std::shared_ptr<miniros::Subscription>_> *)0x4fb629);
    std::shared_ptr<miniros::Subscription>::shared_ptr
              ((shared_ptr<miniros::Subscription> *)in_stack_ffffffffffffff70,&local_80);
    std::__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4fb643);
    Subscription::getInfo((Subscription *)this,info);
    std::shared_ptr<miniros::Subscription>::~shared_ptr
              ((shared_ptr<miniros::Subscription> *)0x4fb65f);
    std::_List_iterator<std::shared_ptr<miniros::Subscription>_>::operator++(&local_68);
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4fb699);
  return;
}

Assistant:

void TopicManager::getBusInfo(XmlRpcValue& info)
{
  // force these guys to be arrays, even if we don't populate them
  info.setSize(0);

  {
    std::scoped_lock<std::recursive_mutex> lock(advertised_topics_mutex_);
    for (PublicationPtr t: advertised_topics_) {
      t->getInfo(info);
    }
  }

  {
    std::scoped_lock<std::mutex> lock(subs_mutex_);
    for (SubscriptionPtr t: subscriptions_) {
      t->getInfo(info);
    }
  }
}